

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2sp_ref.c
# Opt level: O0

int blake2sp_init(blake2sp_state *S,size_t outlen)

{
  int iVar1;
  ulong local_28;
  size_t i;
  size_t outlen_local;
  blake2sp_state *S_local;
  
  if ((outlen == 0) || (0x20 < outlen)) {
    S_local._4_4_ = -1;
  }
  else {
    memset(S->buf,0,0x200);
    S->buflen = 0;
    S->outlen = outlen;
    iVar1 = blake2sp_init_root(S->R,outlen,0);
    if (iVar1 < 0) {
      S_local._4_4_ = -1;
    }
    else {
      for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
        iVar1 = blake2sp_init_leaf(S->S[local_28],outlen,0,(uint32_t)local_28);
        if (iVar1 < 0) {
          return -1;
        }
      }
      S->R[0].last_node = '\x01';
      S->S[7][0].last_node = '\x01';
      S_local._4_4_ = 0;
    }
  }
  return S_local._4_4_;
}

Assistant:

int blake2sp_init( blake2sp_state *S, size_t outlen )
{
  size_t i;

  if( !outlen || outlen > BLAKE2S_OUTBYTES ) return -1;

  memset( S->buf, 0, sizeof( S->buf ) );
  S->buflen = 0;
  S->outlen = outlen;

  if( blake2sp_init_root( S->R, outlen, 0 ) < 0 )
    return -1;

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
    if( blake2sp_init_leaf( S->S[i], outlen, 0, (uint32_t)i ) < 0 ) return -1;

  S->R->last_node = 1;
  S->S[PARALLELISM_DEGREE - 1]->last_node = 1;
  return 0;
}